

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindBase.cxx
# Opt level: O1

void __thiscall cmFindBaseDebugState::~cmFindBaseDebugState(cmFindBaseDebugState *this)

{
  cmFindBase *pcVar1;
  pointer pDVar2;
  size_type sVar3;
  pointer pcVar4;
  string_view sep;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  DebugLibState *state;
  pointer pDVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view prefix;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_13;
  string_view suffix;
  string local_f0;
  string path;
  bool local_9c;
  bool local_9b;
  bool local_9a;
  bool local_99;
  string buffer;
  undefined1 local_78 [16];
  size_type local_68;
  char *pcStack_60;
  size_type local_58;
  char *local_50;
  cmFindBaseDebugState *local_48;
  undefined8 local_40;
  char *pcStack_38;
  
  if ((this->FindCommand->super_cmFindCommon).DebugMode == true) {
    local_78._8_8_ = (this->CommandName)._M_dataplus._M_p;
    local_78._0_8_ = (this->CommandName)._M_string_length;
    local_68._0_1_ = '%';
    local_68._1_1_ = '\0';
    local_68._2_1_ = '\0';
    local_68._3_1_ = '\0';
    local_68._4_1_ = '\0';
    local_68._5_1_ = '\0';
    local_68._6_1_ = '\0';
    local_68._7_1_ = '\0';
    pcStack_60 = " called with the following settings:\n";
    views._M_len = 2;
    views._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&buffer,views);
    pcStack_60 = (this->FindCommand->VariableName)._M_dataplus._M_p;
    local_68 = (this->FindCommand->VariableName)._M_string_length;
    local_78._0_8_ = 7;
    local_78._8_8_ = "  VAR: ";
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&path,views_00);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)path._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path._M_dataplus._M_p != &path.field_2) {
      operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
    }
    local_40 = 10;
    pcStack_38 = "\n         ";
    sep._M_str = "\n         ";
    sep._M_len = 10;
    prefix._M_str = "\"";
    prefix._M_len = 1;
    suffix._M_str = "\"";
    suffix._M_len = 1;
    cmWrap<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_f0,prefix,&this->FindCommand->Names,suffix,sep);
    local_78._0_8_ = 9;
    local_78._8_8_ = "  NAMES: ";
    local_68 = local_f0._M_string_length;
    pcStack_60 = local_f0._M_dataplus._M_p;
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&path,views_01);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)path._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path._M_dataplus._M_p != &path.field_2) {
      operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    pcStack_60 = (this->FindCommand->VariableDocumentation)._M_dataplus._M_p;
    local_68 = (this->FindCommand->VariableDocumentation)._M_string_length;
    local_78._0_8_ = 0x11;
    local_78._8_8_ = "  Documentation: ";
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&path,views_02);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)path._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path._M_dataplus._M_p != &path.field_2) {
      operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&buffer);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkOnly
              );
    local_78._0_8_ = 0x1c;
    local_78._8_8_ = "    Only Search Frameworks: ";
    local_68 = (size_type)path._M_dataplus._M_p;
    pcStack_60 = (char *)path._M_string_length;
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_03._M_len = 3;
    views_03._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&local_f0,views_03);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkLast
              );
    local_78._0_8_ = 0x1c;
    local_78._8_8_ = "    Search Frameworks Last: ";
    local_68 = (size_type)path._M_dataplus._M_p;
    pcStack_60 = (char *)path._M_string_length;
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_04._M_len = 3;
    views_04._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&local_f0,views_04);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,
               (uint)(this->FindCommand->super_cmFindCommon).SearchFrameworkFirst);
    local_78._0_8_ = 0x1d;
    local_78._8_8_ = "    Search Frameworks First: ";
    local_68 = (size_type)path._M_dataplus._M_p;
    pcStack_60 = (char *)path._M_string_length;
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_05._M_len = 3;
    views_05._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&local_f0,views_05);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&buffer);
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleOnly
              );
    local_78._0_8_ = 0x1b;
    local_78._8_8_ = "    Only Search AppBundle: ";
    local_68 = (size_type)path._M_dataplus._M_p;
    pcStack_60 = (char *)path._M_string_length;
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_06._M_len = 3;
    views_06._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&local_f0,views_06);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,(uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleLast
              );
    local_78._0_8_ = 0x1b;
    local_78._8_8_ = "    Search AppBundle Last: ";
    local_68 = (size_type)path._M_dataplus._M_p;
    pcStack_60 = (char *)path._M_string_length;
    local_58._0_1_ = '\x01';
    local_58._1_1_ = '\0';
    local_58._2_1_ = '\0';
    local_58._3_1_ = '\0';
    local_58._4_1_ = '\0';
    local_58._5_1_ = '\0';
    local_58._6_1_ = '\0';
    local_58._7_1_ = '\0';
    local_50 = "\n";
    views_07._M_len = 3;
    views_07._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&local_f0,views_07);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    cmAlphaNum::cmAlphaNum
              ((cmAlphaNum *)&path,
               (uint)(this->FindCommand->super_cmFindCommon).SearchAppBundleFirst);
    local_78._0_8_ = 0x1c;
    local_78._8_8_ = "    Search AppBundle First: ";
    local_68 = (size_type)path._M_dataplus._M_p;
    pcStack_60 = (char *)path._M_string_length;
    local_58 = 1;
    local_50 = "\n";
    views_08._M_len = 3;
    views_08._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&local_f0,views_08);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((this->FindCommand->super_cmFindCommon).NoDefaultPath == true) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      local_78._0_8_ = 0x1d;
      local_78._8_8_ = "  CMAKE_FIND_USE_CMAKE_PATH: ";
      cmAlphaNum::cmAlphaNum
                ((cmAlphaNum *)&path,(this->FindCommand->super_cmFindCommon).NoCMakePath ^ 1);
      pcVar1 = this->FindCommand;
      local_99 = (bool)((pcVar1->super_cmFindCommon).NoCMakeEnvironmentPath ^ 1);
      local_9a = (bool)((pcVar1->super_cmFindCommon).NoSystemEnvironmentPath ^ 1);
      local_9b = (bool)((pcVar1->super_cmFindCommon).NoCMakeSystemPath ^ 1);
      local_9c = (bool)((pcVar1->super_cmFindCommon).NoCMakeInstallPath ^ 1);
      cmStrCat<char[2],char[42],bool,char[2],char[43],bool,char[2],char[37],bool,char[2],char[34],bool,char[2]>
                (&local_f0,(cmAlphaNum *)local_78,(cmAlphaNum *)&path,(char (*) [2])0x7201e9,
                 (char (*) [42])"  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",&local_99,
                 (char (*) [2])0x7201e9,(char (*) [43])"  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
                 &local_9a,(char (*) [2])0x7201e9,
                 (char (*) [37])"  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",&local_9b,
                 (char (*) [2])0x7201e9,(char (*) [34])"  CMAKE_FIND_USE_INSTALL_PREFIX: ",&local_9c
                 ,(char (*) [2])0x7201e9);
      std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
    local_78._8_8_ = (this->CommandName)._M_dataplus._M_p;
    local_78._0_8_ = (this->CommandName)._M_string_length;
    local_68 = 0x25;
    pcStack_60 = " considered the following locations:\n";
    views_09._M_len = 2;
    views_09._M_array = (iterator)local_78;
    cmCatViews_abi_cxx11_(&path,views_09);
    std::__cxx11::string::_M_append((char *)&buffer,(ulong)path._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)path._M_dataplus._M_p != &path.field_2) {
      operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
    }
    pDVar6 = (this->FailedSearchLocations).
             super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pDVar2 = (this->FailedSearchLocations).
             super__Vector_base<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_48 = this;
    if (pDVar6 != pDVar2) {
      do {
        pcStack_60 = (pDVar6->path)._M_dataplus._M_p;
        local_68 = (pDVar6->path)._M_string_length;
        local_78._0_8_ = 2;
        local_78._8_8_ = "  ";
        views_10._M_len = 2;
        views_10._M_array = (iterator)local_78;
        cmCatViews_abi_cxx11_(&path,views_10);
        if ((pDVar6->regexName)._M_string_length != 0) {
          local_78._0_8_ = path._M_string_length;
          local_78._8_8_ = path._M_dataplus._M_p;
          local_68._0_1_ = '\x01';
          local_68._1_1_ = '\0';
          local_68._2_1_ = '\0';
          local_68._3_1_ = '\0';
          local_68._4_1_ = '\0';
          local_68._5_1_ = '\0';
          local_68._6_1_ = '\0';
          local_68._7_1_ = '\0';
          pcStack_60 = "/";
          local_50 = (pDVar6->regexName)._M_dataplus._M_p;
          local_58 = (pDVar6->regexName)._M_string_length;
          views_11._M_len = 3;
          views_11._M_array = (iterator)local_78;
          cmCatViews_abi_cxx11_(&local_f0,views_11);
          std::__cxx11::string::operator=((string *)&path,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
        }
        local_78._0_8_ = path._M_string_length;
        local_78._8_8_ = path._M_dataplus._M_p;
        local_68 = 1;
        pcStack_60 = "\n";
        views_12._M_len = 2;
        views_12._M_array = (iterator)local_78;
        cmCatViews_abi_cxx11_(&local_f0,views_12);
        std::__cxx11::string::_M_append((char *)&buffer,(ulong)local_f0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)path._M_dataplus._M_p != &path.field_2) {
          operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
        }
        pDVar6 = pDVar6 + 1;
      } while (pDVar6 != pDVar2);
    }
    this = local_48;
    sVar3 = (local_48->FoundSearchLocation).path._M_string_length;
    if (sVar3 == 0) {
      std::__cxx11::string::append((char *)&buffer);
    }
    else {
      pcStack_60 = (local_48->FoundSearchLocation).path._M_dataplus._M_p;
      local_78._0_8_ = 0x18;
      local_78._8_8_ = "The item was found at\n  ";
      local_58 = 1;
      local_50 = "\n";
      views_13._M_len = 3;
      views_13._M_array = (iterator)local_78;
      local_68 = sVar3;
      cmCatViews_abi_cxx11_(&path,views_13);
      std::__cxx11::string::_M_append((char *)&buffer,(ulong)path._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)path._M_dataplus._M_p != &path.field_2) {
        operator_delete(path._M_dataplus._M_p,path.field_2._M_allocated_capacity + 1);
      }
    }
    cmFindCommon::DebugMessage(&this->FindCommand->super_cmFindCommon,&buffer);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)buffer._M_dataplus._M_p != &buffer.field_2) {
      operator_delete(buffer._M_dataplus._M_p,buffer.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar4 = (this->FoundSearchLocation).path._M_dataplus._M_p;
  paVar5 = &(this->FoundSearchLocation).path.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->FoundSearchLocation).regexName._M_dataplus._M_p;
  paVar5 = &(this->FoundSearchLocation).regexName.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  std::
  vector<cmFindBaseDebugState::DebugLibState,_std::allocator<cmFindBaseDebugState::DebugLibState>_>
  ::~vector(&this->FailedSearchLocations);
  pcVar4 = (this->CommandName)._M_dataplus._M_p;
  paVar5 = &(this->CommandName).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

cmFindBaseDebugState::~cmFindBaseDebugState()
{
  if (this->FindCommand->DebugMode) {
    std::string buffer =
      cmStrCat(this->CommandName, " called with the following settings:\n");
    buffer += cmStrCat("  VAR: ", this->FindCommand->VariableName, "\n");
    buffer += cmStrCat(
      "  NAMES: ", cmWrap("\"", this->FindCommand->Names, "\"", "\n         "),
      "\n");
    buffer += cmStrCat(
      "  Documentation: ", this->FindCommand->VariableDocumentation, "\n");
    buffer += "  Framework\n";
    buffer += cmStrCat("    Only Search Frameworks: ",
                       this->FindCommand->SearchFrameworkOnly, "\n");

    buffer += cmStrCat("    Search Frameworks Last: ",
                       this->FindCommand->SearchFrameworkLast, "\n");
    buffer += cmStrCat("    Search Frameworks First: ",
                       this->FindCommand->SearchFrameworkFirst, "\n");
    buffer += "  AppBundle\n";
    buffer += cmStrCat("    Only Search AppBundle: ",
                       this->FindCommand->SearchAppBundleOnly, "\n");
    buffer += cmStrCat("    Search AppBundle Last: ",
                       this->FindCommand->SearchAppBundleLast, "\n");
    buffer += cmStrCat("    Search AppBundle First: ",
                       this->FindCommand->SearchAppBundleFirst, "\n");

    if (this->FindCommand->NoDefaultPath) {
      buffer += "  NO_DEFAULT_PATH Enabled\n";
    } else {
      buffer += cmStrCat(
        "  CMAKE_FIND_USE_CMAKE_PATH: ", !this->FindCommand->NoCMakePath, "\n",
        "  CMAKE_FIND_USE_CMAKE_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoCMakeEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_SYSTEM_ENVIRONMENT_PATH: ",
        !this->FindCommand->NoSystemEnvironmentPath, "\n",
        "  CMAKE_FIND_USE_CMAKE_SYSTEM_PATH: ",
        !this->FindCommand->NoCMakeSystemPath, "\n",
        "  CMAKE_FIND_USE_INSTALL_PREFIX: ",
        !this->FindCommand->NoCMakeInstallPath, "\n");
    }

    buffer +=
      cmStrCat(this->CommandName, " considered the following locations:\n");
    for (auto const& state : this->FailedSearchLocations) {
      std::string path = cmStrCat("  ", state.path);
      if (!state.regexName.empty()) {
        path = cmStrCat(path, "/", state.regexName);
      }
      buffer += cmStrCat(path, "\n");
    }

    if (!this->FoundSearchLocation.path.empty()) {
      buffer += cmStrCat("The item was found at\n  ",
                         this->FoundSearchLocation.path, "\n");
    } else {
      buffer += "The item was not found.\n";
    }

    this->FindCommand->DebugMessage(buffer);
  }
}